

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O1

void asio::detail::
     executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  code *pcVar1;
  allocator<void> allocator;
  binder0<std::function<void_()>_> handler;
  ptr p;
  allocator<void> local_49;
  scheduler_operation *local_48;
  func_type p_Stack_40;
  code *local_38;
  scheduler_operation *local_30;
  ptr local_20;
  
  local_20.a = &local_49;
  local_48 = (scheduler_operation *)0x0;
  p_Stack_40 = (func_type)0x0;
  local_38 = (code *)0x0;
  local_30 = base[2].next_;
  pcVar1 = *(code **)&base[1].task_result_;
  if (pcVar1 != (code *)0x0) {
    local_48 = base[1].next_;
    p_Stack_40 = base[1].func_;
    *(undefined8 *)&base[1].task_result_ = 0;
    base[2].next_ = (scheduler_operation *)0x0;
    local_38 = pcVar1;
  }
  local_20.v = base;
  local_20.p = (executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
                *)base;
  ptr::reset(&local_20);
  if (owner != (void *)0x0) {
    if (local_38 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)local_30)();
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  ptr::reset(&local_20);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }